

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O2

void __thiscall blc::math::Float::align(Float *this)

{
  int iVar1;
  double dVar2;
  
  dVar2 = this->_nb;
  iVar1 = this->_E;
  if (ABS(dVar2) <= 1.0) {
    while (iVar1 = iVar1 + -1, ABS(dVar2) < 1.0) {
      this->_E = iVar1;
      dVar2 = dVar2 * 10.0;
      this->_nb = dVar2;
    }
  }
  else {
    while (iVar1 = iVar1 + 1, 10.0 <= ABS(dVar2)) {
      this->_E = iVar1;
      dVar2 = dVar2 / 10.0;
      this->_nb = dVar2;
    }
  }
  return;
}

Assistant:

void blc::math::Float::align() {
	if (this->_nb > 1 || this->_nb < -1) {
		for (; this->_nb >= 10 || this->_nb <= -10;) {
			this->_E++;
			this->_nb /= 10;
		}
	} else {
		for (; this->_nb < 1 && this->_nb > -1;) {
			this->_E--;
			this->_nb *= 10;
		}
	}
}